

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_UnitSystem::IsValid(ON_UnitSystem *this)

{
  LengthUnitSystem LVar1;
  LengthUnitSystem LVar2;
  bool bVar3;
  ON_UnitSystem *this_local;
  
  LVar1 = this->m_unit_system;
  LVar2 = ON::LengthUnitSystemFromUnsigned((uint)this->m_unit_system);
  if (LVar1 == LVar2) {
    if (this->m_unit_system == Unset) {
      this_local._7_1_ = false;
    }
    else if ((this->m_unit_system != CustomUnits) ||
            (bVar3 = ON_IsValidPositiveNumber(this->m_meters_per_custom_unit), bVar3)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_UnitSystem::IsValid() const
{
  if ( m_unit_system != ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(m_unit_system)) )
  {
    // invalid enum value
    return false;
  }

  if (ON::LengthUnitSystem::Unset == m_unit_system)
    return false;

  if (ON::LengthUnitSystem::CustomUnits == m_unit_system)
  {
    if (false == ON_IsValidPositiveNumber(m_meters_per_custom_unit))
      return false;
  }

  return true;
}